

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::NeuralNetworkLayer::clear_layer(NeuralNetworkLayer *this)

{
  LayerCase LVar1;
  NeuralNetworkLayer *this_local;
  
  LVar1 = layer_case(this);
  if (LVar1 < 0x5c0) {
    (*(code *)(&DAT_0044763c + *(int *)(&DAT_0044763c + (ulong)LVar1 * 4)))();
    return;
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void NeuralNetworkLayer::clear_layer() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.NeuralNetworkLayer)
  switch (layer_case()) {
    case kConvolution: {
      delete layer_.convolution_;
      break;
    }
    case kPooling: {
      delete layer_.pooling_;
      break;
    }
    case kActivation: {
      delete layer_.activation_;
      break;
    }
    case kInnerProduct: {
      delete layer_.innerproduct_;
      break;
    }
    case kEmbedding: {
      delete layer_.embedding_;
      break;
    }
    case kBatchnorm: {
      delete layer_.batchnorm_;
      break;
    }
    case kMvn: {
      delete layer_.mvn_;
      break;
    }
    case kL2Normalize: {
      delete layer_.l2normalize_;
      break;
    }
    case kSoftmax: {
      delete layer_.softmax_;
      break;
    }
    case kLrn: {
      delete layer_.lrn_;
      break;
    }
    case kCrop: {
      delete layer_.crop_;
      break;
    }
    case kPadding: {
      delete layer_.padding_;
      break;
    }
    case kUpsample: {
      delete layer_.upsample_;
      break;
    }
    case kResizeBilinear: {
      delete layer_.resizebilinear_;
      break;
    }
    case kCropResize: {
      delete layer_.cropresize_;
      break;
    }
    case kUnary: {
      delete layer_.unary_;
      break;
    }
    case kAdd: {
      delete layer_.add_;
      break;
    }
    case kMultiply: {
      delete layer_.multiply_;
      break;
    }
    case kAverage: {
      delete layer_.average_;
      break;
    }
    case kScale: {
      delete layer_.scale_;
      break;
    }
    case kBias: {
      delete layer_.bias_;
      break;
    }
    case kMax: {
      delete layer_.max_;
      break;
    }
    case kMin: {
      delete layer_.min_;
      break;
    }
    case kDot: {
      delete layer_.dot_;
      break;
    }
    case kReduce: {
      delete layer_.reduce_;
      break;
    }
    case kLoadConstant: {
      delete layer_.loadconstant_;
      break;
    }
    case kReshape: {
      delete layer_.reshape_;
      break;
    }
    case kFlatten: {
      delete layer_.flatten_;
      break;
    }
    case kPermute: {
      delete layer_.permute_;
      break;
    }
    case kConcat: {
      delete layer_.concat_;
      break;
    }
    case kSplit: {
      delete layer_.split_;
      break;
    }
    case kSequenceRepeat: {
      delete layer_.sequencerepeat_;
      break;
    }
    case kReorganizeData: {
      delete layer_.reorganizedata_;
      break;
    }
    case kSlice: {
      delete layer_.slice_;
      break;
    }
    case kSimpleRecurrent: {
      delete layer_.simplerecurrent_;
      break;
    }
    case kGru: {
      delete layer_.gru_;
      break;
    }
    case kUniDirectionalLSTM: {
      delete layer_.unidirectionallstm_;
      break;
    }
    case kBiDirectionalLSTM: {
      delete layer_.bidirectionallstm_;
      break;
    }
    case kCustom: {
      delete layer_.custom_;
      break;
    }
    case kCopy: {
      delete layer_.copy_;
      break;
    }
    case kBranch: {
      delete layer_.branch_;
      break;
    }
    case kLoop: {
      delete layer_.loop_;
      break;
    }
    case kLoopBreak: {
      delete layer_.loopbreak_;
      break;
    }
    case kLoopContinue: {
      delete layer_.loopcontinue_;
      break;
    }
    case kRangeStatic: {
      delete layer_.rangestatic_;
      break;
    }
    case kRangeDynamic: {
      delete layer_.rangedynamic_;
      break;
    }
    case kClip: {
      delete layer_.clip_;
      break;
    }
    case kCeil: {
      delete layer_.ceil_;
      break;
    }
    case kFloor: {
      delete layer_.floor_;
      break;
    }
    case kSign: {
      delete layer_.sign_;
      break;
    }
    case kRound: {
      delete layer_.round_;
      break;
    }
    case kExp2: {
      delete layer_.exp2_;
      break;
    }
    case kSin: {
      delete layer_.sin_;
      break;
    }
    case kCos: {
      delete layer_.cos_;
      break;
    }
    case kTan: {
      delete layer_.tan_;
      break;
    }
    case kAsin: {
      delete layer_.asin_;
      break;
    }
    case kAcos: {
      delete layer_.acos_;
      break;
    }
    case kAtan: {
      delete layer_.atan_;
      break;
    }
    case kSinh: {
      delete layer_.sinh_;
      break;
    }
    case kCosh: {
      delete layer_.cosh_;
      break;
    }
    case kTanh: {
      delete layer_.tanh_;
      break;
    }
    case kAsinh: {
      delete layer_.asinh_;
      break;
    }
    case kAcosh: {
      delete layer_.acosh_;
      break;
    }
    case kAtanh: {
      delete layer_.atanh_;
      break;
    }
    case kErf: {
      delete layer_.erf_;
      break;
    }
    case kGelu: {
      delete layer_.gelu_;
      break;
    }
    case kEqual: {
      delete layer_.equal_;
      break;
    }
    case kNotEqual: {
      delete layer_.notequal_;
      break;
    }
    case kLessThan: {
      delete layer_.lessthan_;
      break;
    }
    case kLessEqual: {
      delete layer_.lessequal_;
      break;
    }
    case kGreaterThan: {
      delete layer_.greaterthan_;
      break;
    }
    case kGreaterEqual: {
      delete layer_.greaterequal_;
      break;
    }
    case kLogicalOr: {
      delete layer_.logicalor_;
      break;
    }
    case kLogicalXor: {
      delete layer_.logicalxor_;
      break;
    }
    case kLogicalNot: {
      delete layer_.logicalnot_;
      break;
    }
    case kLogicalAnd: {
      delete layer_.logicaland_;
      break;
    }
    case kModBroadcastable: {
      delete layer_.modbroadcastable_;
      break;
    }
    case kMinBroadcastable: {
      delete layer_.minbroadcastable_;
      break;
    }
    case kMaxBroadcastable: {
      delete layer_.maxbroadcastable_;
      break;
    }
    case kAddBroadcastable: {
      delete layer_.addbroadcastable_;
      break;
    }
    case kPowBroadcastable: {
      delete layer_.powbroadcastable_;
      break;
    }
    case kDivideBroadcastable: {
      delete layer_.dividebroadcastable_;
      break;
    }
    case kFloorDivBroadcastable: {
      delete layer_.floordivbroadcastable_;
      break;
    }
    case kMultiplyBroadcastable: {
      delete layer_.multiplybroadcastable_;
      break;
    }
    case kSubtractBroadcastable: {
      delete layer_.subtractbroadcastable_;
      break;
    }
    case kTile: {
      delete layer_.tile_;
      break;
    }
    case kStack: {
      delete layer_.stack_;
      break;
    }
    case kGather: {
      delete layer_.gather_;
      break;
    }
    case kScatter: {
      delete layer_.scatter_;
      break;
    }
    case kGatherND: {
      delete layer_.gathernd_;
      break;
    }
    case kScatterND: {
      delete layer_.scatternd_;
      break;
    }
    case kSoftmaxND: {
      delete layer_.softmaxnd_;
      break;
    }
    case kGatherAlongAxis: {
      delete layer_.gatheralongaxis_;
      break;
    }
    case kScatterAlongAxis: {
      delete layer_.scatteralongaxis_;
      break;
    }
    case kReverse: {
      delete layer_.reverse_;
      break;
    }
    case kReverseSeq: {
      delete layer_.reverseseq_;
      break;
    }
    case kSplitND: {
      delete layer_.splitnd_;
      break;
    }
    case kConcatND: {
      delete layer_.concatnd_;
      break;
    }
    case kTranspose: {
      delete layer_.transpose_;
      break;
    }
    case kSliceStatic: {
      delete layer_.slicestatic_;
      break;
    }
    case kSliceDynamic: {
      delete layer_.slicedynamic_;
      break;
    }
    case kSlidingWindows: {
      delete layer_.slidingwindows_;
      break;
    }
    case kTopK: {
      delete layer_.topk_;
      break;
    }
    case kArgMin: {
      delete layer_.argmin_;
      break;
    }
    case kArgMax: {
      delete layer_.argmax_;
      break;
    }
    case kEmbeddingND: {
      delete layer_.embeddingnd_;
      break;
    }
    case kBatchedMatmul: {
      delete layer_.batchedmatmul_;
      break;
    }
    case kGetShape: {
      delete layer_.getshape_;
      break;
    }
    case kLoadConstantND: {
      delete layer_.loadconstantnd_;
      break;
    }
    case kFillLike: {
      delete layer_.filllike_;
      break;
    }
    case kFillStatic: {
      delete layer_.fillstatic_;
      break;
    }
    case kFillDynamic: {
      delete layer_.filldynamic_;
      break;
    }
    case kBroadcastToLike: {
      delete layer_.broadcasttolike_;
      break;
    }
    case kBroadcastToStatic: {
      delete layer_.broadcasttostatic_;
      break;
    }
    case kBroadcastToDynamic: {
      delete layer_.broadcasttodynamic_;
      break;
    }
    case kSqueeze: {
      delete layer_.squeeze_;
      break;
    }
    case kExpandDims: {
      delete layer_.expanddims_;
      break;
    }
    case kFlattenTo2D: {
      delete layer_.flattento2d_;
      break;
    }
    case kReshapeLike: {
      delete layer_.reshapelike_;
      break;
    }
    case kReshapeStatic: {
      delete layer_.reshapestatic_;
      break;
    }
    case kReshapeDynamic: {
      delete layer_.reshapedynamic_;
      break;
    }
    case kRankPreservingReshape: {
      delete layer_.rankpreservingreshape_;
      break;
    }
    case kConstantPad: {
      delete layer_.constantpad_;
      break;
    }
    case kRandomNormalLike: {
      delete layer_.randomnormallike_;
      break;
    }
    case kRandomNormalStatic: {
      delete layer_.randomnormalstatic_;
      break;
    }
    case kRandomNormalDynamic: {
      delete layer_.randomnormaldynamic_;
      break;
    }
    case kRandomUniformLike: {
      delete layer_.randomuniformlike_;
      break;
    }
    case kRandomUniformStatic: {
      delete layer_.randomuniformstatic_;
      break;
    }
    case kRandomUniformDynamic: {
      delete layer_.randomuniformdynamic_;
      break;
    }
    case kRandomBernoulliLike: {
      delete layer_.randombernoullilike_;
      break;
    }
    case kRandomBernoulliStatic: {
      delete layer_.randombernoullistatic_;
      break;
    }
    case kRandomBernoulliDynamic: {
      delete layer_.randombernoullidynamic_;
      break;
    }
    case kCategoricalDistribution: {
      delete layer_.categoricaldistribution_;
      break;
    }
    case kReduceL1: {
      delete layer_.reducel1_;
      break;
    }
    case kReduceL2: {
      delete layer_.reducel2_;
      break;
    }
    case kReduceMax: {
      delete layer_.reducemax_;
      break;
    }
    case kReduceMin: {
      delete layer_.reducemin_;
      break;
    }
    case kReduceSum: {
      delete layer_.reducesum_;
      break;
    }
    case kReduceProd: {
      delete layer_.reduceprod_;
      break;
    }
    case kReduceMean: {
      delete layer_.reducemean_;
      break;
    }
    case kReduceLogSum: {
      delete layer_.reducelogsum_;
      break;
    }
    case kReduceSumSquare: {
      delete layer_.reducesumsquare_;
      break;
    }
    case kReduceLogSumExp: {
      delete layer_.reducelogsumexp_;
      break;
    }
    case kWhereNonZero: {
      delete layer_.wherenonzero_;
      break;
    }
    case kMatrixBandPart: {
      delete layer_.matrixbandpart_;
      break;
    }
    case kLowerTriangular: {
      delete layer_.lowertriangular_;
      break;
    }
    case kUpperTriangular: {
      delete layer_.uppertriangular_;
      break;
    }
    case kWhereBroadcastable: {
      delete layer_.wherebroadcastable_;
      break;
    }
    case kLayerNormalization: {
      delete layer_.layernormalization_;
      break;
    }
    case kNonMaximumSuppression: {
      delete layer_.nonmaximumsuppression_;
      break;
    }
    case kOneHot: {
      delete layer_.onehot_;
      break;
    }
    case kCumSum: {
      delete layer_.cumsum_;
      break;
    }
    case kClampedReLU: {
      delete layer_.clampedrelu_;
      break;
    }
    case kArgSort: {
      delete layer_.argsort_;
      break;
    }
    case kPooling3D: {
      delete layer_.pooling3d_;
      break;
    }
    case kGlobalPooling3D: {
      delete layer_.globalpooling3d_;
      break;
    }
    case kSliceBySize: {
      delete layer_.slicebysize_;
      break;
    }
    case kConvolution3D: {
      delete layer_.convolution3d_;
      break;
    }
    case LAYER_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = LAYER_NOT_SET;
}